

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# clufactor.hpp
# Opt level: O2

void __thiscall
soplex::CLUFactor<double>::vSolveRight4update3sparse
          (CLUFactor<double> *this,double eps,double *vec,int *idx,double *rhs,int *ridx,int *rn,
          double eps2,double *vec2,int *idx2,double *rhs2,int *ridx2,int *rn2,double eps3,
          double *vec3,int *idx3,double *rhs3,int *ridx3,int *rn3,double *forest,int *forestNum,
          int *forestIdx)

{
  double dVar1;
  int *piVar2;
  CLUFactor<double> *this_00;
  int iVar3;
  long lVar4;
  int *it;
  int *piVar5;
  double dVar6;
  int j;
  double local_88;
  int *local_80;
  double *local_78;
  double local_70;
  double local_68;
  double *local_60;
  int *local_58;
  CLUFactor<double> *local_50;
  double local_48;
  undefined8 uStack_40;
  
  local_88 = eps;
  local_80 = ridx;
  local_78 = rhs;
  local_70 = eps2;
  local_68 = eps3;
  local_60 = vec;
  local_58 = idx;
  vSolveLright3(this,rhs,ridx,rn,eps,rhs2,ridx2,rn2,eps2,rhs3,ridx3,rn3,eps3);
  piVar2 = (this->row).perm;
  j = 0;
  piVar5 = local_80;
  dVar6 = local_88;
  local_50 = this;
  if (forest == (double *)0x0) {
    for (lVar4 = 0; lVar4 < *rn; lVar4 = lVar4 + 1) {
      iVar3 = piVar5[lVar4];
      if (ABS(local_78[iVar3]) <= dVar6) {
        local_78[iVar3] = 0.0;
      }
      else {
        enQueueMax(piVar5,&j,piVar2[iVar3]);
        piVar5 = local_80;
        dVar6 = local_88;
      }
    }
    *rn = j;
  }
  else {
    for (lVar4 = 0; lVar4 < *rn; lVar4 = lVar4 + 1) {
      iVar3 = piVar5[lVar4];
      dVar1 = local_78[iVar3];
      if (ABS(dVar1) <= dVar6) {
        local_78[iVar3] = 0.0;
      }
      else {
        *forestIdx = iVar3;
        forestIdx = forestIdx + 1;
        uStack_40 = 0;
        local_48 = dVar1;
        enQueueMax(piVar5,&j,piVar2[iVar3]);
        forest[iVar3] = local_48;
        piVar5 = local_80;
        dVar6 = local_88;
      }
    }
    *rn = j;
    *forestNum = j;
  }
  j = 0;
  for (lVar4 = 0; lVar4 < *rn2; lVar4 = lVar4 + 1) {
    iVar3 = ridx2[lVar4];
    if (ABS(rhs2[iVar3]) <= local_70) {
      rhs2[iVar3] = 0.0;
    }
    else {
      enQueueMax(ridx2,&j,piVar2[iVar3]);
      piVar5 = local_80;
      dVar6 = local_88;
    }
  }
  *rn2 = j;
  j = 0;
  for (lVar4 = 0; this_00 = local_50, lVar4 < *rn3; lVar4 = lVar4 + 1) {
    iVar3 = ridx3[lVar4];
    if (ABS(rhs3[iVar3]) <= local_68) {
      rhs3[iVar3] = 0.0;
    }
    else {
      enQueueMax(ridx3,&j,piVar2[iVar3]);
      piVar5 = local_80;
      dVar6 = local_88;
    }
  }
  *rn3 = j;
  iVar3 = vSolveUright(local_50,local_60,local_58,local_78,piVar5,*rn,dVar6);
  *rn = iVar3;
  iVar3 = vSolveUright(this_00,vec2,idx2,rhs2,ridx2,*rn2,local_70);
  *rn2 = iVar3;
  iVar3 = vSolveUright(this_00,vec3,idx3,rhs3,ridx3,*rn3,local_68);
  *rn3 = iVar3;
  if ((this_00->l).updateType == 0) {
    iVar3 = vSolveUpdateRight(this_00,local_60,local_58,*rn,local_88);
    *rn = iVar3;
    iVar3 = vSolveUpdateRight(this_00,vec2,idx2,*rn2,local_70);
    *rn2 = iVar3;
    iVar3 = vSolveUpdateRight(this_00,vec3,idx3,*rn3,local_68);
    *rn3 = iVar3;
  }
  return;
}

Assistant:

void CLUFactor<R>::vSolveRight4update3sparse(R eps, R* vec, int* idx,         /* result1 */
      R* rhs, int* ridx, int& rn,        /* rhs1    */
      R eps2, R* vec2, int* idx2,     /* result2 */
      R* rhs2, int* ridx2, int& rn2,     /* rhs2    */
      R eps3, R* vec3, int* idx3,     /* result3 */
      R* rhs3, int* ridx3, int& rn3,     /* rhs3    */
      R* forest, int* forestNum, int* forestIdx)
{
   vSolveLright3(rhs, ridx, rn, eps, rhs2, ridx2, rn2, eps2, rhs3, ridx3, rn3, eps3);
   assert(rn >= 0 && rn <= thedim);
   assert(rn2 >= 0 && rn2 <= thedim);
   assert(rn3 >= 0 && rn3 <= thedim);

   R x;
   int i, j, k;
   int* rperm = row.perm;

   /*  turn index list into a heap */
   if(forest)
   {
      int* it = forestIdx;

      for(i = j = 0; i < rn; ++i)
      {
         k = ridx[i];
         assert(k >= 0 && k < thedim);
         x = rhs[k];

         if(isNotZero(x, eps))
         {
            enQueueMax(ridx, &j, rperm[*it++ = k]);
            forest[k] = x;
         }
         else
            rhs[k] = 0;
      }

      *forestNum = rn = j;
   }
   else
   {
      for(i = j = 0; i < rn; ++i)
      {
         k = ridx[i];
         assert(k >= 0 && k < thedim);
         x = rhs[k];

         if(isNotZero(x, eps))
            enQueueMax(ridx, &j, rperm[k]);
         else
            rhs[k] = 0;
      }

      rn = j;
   }

   for(i = j = 0; i < rn2; ++i)
   {
      k = ridx2[i];
      assert(k >= 0 && k < thedim);
      x = rhs2[k];

      if(isNotZero(x, eps2))
         enQueueMax(ridx2, &j, rperm[k]);
      else
         rhs2[k] = 0;
   }

   rn2 = j;

   for(i = j = 0; i < rn3; ++i)
   {
      k = ridx3[i];
      assert(k >= 0 && k < thedim);
      x = rhs3[k];

      if(isNotZero(x, eps3))
         enQueueMax(ridx3, &j, rperm[k]);
      else
         rhs3[k] = 0;
   }

   rn3 = j;

   rn = vSolveUright(vec, idx, rhs, ridx, rn, eps);
   rn2 = vSolveUright(vec2, idx2, rhs2, ridx2, rn2, eps2);
   rn3 = vSolveUright(vec3, idx3, rhs3, ridx3, rn3, eps3);

   if(!l.updateType)             /* no Forest-Tomlin Updates */
   {
      rn = vSolveUpdateRight(vec, idx, rn, eps);
      rn2 = vSolveUpdateRight(vec2, idx2, rn2, eps2);
      rn3 = vSolveUpdateRight(vec3, idx3, rn3, eps3);
   }
}